

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fwd.hh
# Opt level: O3

void tchecker::ts::initial<tchecker::refzg::refzg_t>
               (refzg_t *fwd_impl,
               vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_>_>
               *v,state_status_t mask)

{
  values_iterator_t begin;
  cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>
  __begin0;
  initial_range_t init_edges;
  initial_value_t local_e0;
  cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>
  local_d0;
  cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>
  local_80;
  
  syncprod::initial_edges
            ((initial_range_t *)&local_80,
             &((fwd_impl->_system).
               super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_system_t);
  cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>
  ::cartesian_iterator_t(&local_d0,&local_80);
  if (local_d0._nranges != 0) {
    do {
      if (((local_d0._its.
            super__Vector_base<tchecker::system::locs_t::const_iterator_t,_std::allocator<tchecker::system::locs_t::const_iterator_t>_>
            ._M_impl.super__Vector_impl_data._M_start)->super_const_iterator)._M_current ==
          ((local_d0._ends.
            super__Vector_base<tchecker::system::locs_t::const_iterator_t,_std::allocator<tchecker::system::locs_t::const_iterator_t>_>
            ._M_impl.super__Vector_impl_data._M_start)->super_const_iterator)._M_current) break;
      local_e0._begin._it._M_current =
           (iterator)
           (iterator)
           local_d0._its.
           super__Vector_base<tchecker::system::locs_t::const_iterator_t,_std::allocator<tchecker::system::locs_t::const_iterator_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_e0._end._it._M_current =
           (iterator)
           (iterator)
           local_d0._its.
           super__Vector_base<tchecker::system::locs_t::const_iterator_t,_std::allocator<tchecker::system::locs_t::const_iterator_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      refzg::refzg_t::initial(fwd_impl,&local_e0,v,mask);
      cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>
      ::operator++(&local_d0);
    } while (local_d0._nranges != 0);
  }
  cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>
  ::~cartesian_iterator_t(&local_d0);
  cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>
  ::~cartesian_iterator_t(&local_80);
  return;
}

Assistant:

void initial(FWD_IMPL & fwd_impl, std::vector<typename FWD_IMPL::sst_t> & v, tchecker::state_status_t mask)
{
  typename FWD_IMPL::initial_range_t init_edges = fwd_impl.initial_edges();
  for (typename FWD_IMPL::initial_value_t && init_edge : init_edges)
    fwd_impl.initial(init_edge, v, mask);
}